

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

bool __thiscall JSON::getString(JSON *this,string *utf8)

{
  bool bVar1;
  element_type *peVar2;
  pointer pJVar3;
  long local_40;
  JSON_string *v;
  string *utf8_local;
  JSON *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pJVar3 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::operator->
                       (&peVar2->value);
    if (pJVar3->type_code == vt_string) {
      peVar2 = std::__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<JSON::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pJVar3 = std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::get
                         (&peVar2->value);
      if (pJVar3 == (pointer)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = __dynamic_cast(pJVar3,&JSON_value::typeinfo,&JSON_string::typeinfo,0);
      }
      std::__cxx11::string::operator=((string *)utf8,(string *)(local_40 + 0x10));
      return true;
    }
  }
  return false;
}

Assistant:

bool
JSON::getString(std::string& utf8) const
{
    if (m && m->value->type_code == vt_string) {
        auto v = dynamic_cast<JSON_string const*>(m->value.get());
        utf8 = v->utf8;
        return true;
    }
    return false;
}